

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O1

int ply_write(p_ply ply,double value)

{
  p_ply_property ptVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  e_ply_type eVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  p_ply_element ptVar13;
  
  lVar3 = ply->welement;
  if (lVar3 <= ply->nelements) {
    lVar4 = ply->wproperty;
    if (lVar4 <= ply->element[lVar3].nproperties) {
      ptVar13 = ply->element + lVar3;
      ptVar1 = ptVar13->property + lVar4;
      eVar6 = ptVar13->property[lVar4].type;
      if (eVar6 == PLY_LIST) {
        if (ply->wvalue_index == 0) {
          eVar6 = ptVar1->length_type;
          ply->wlength = (long)value;
        }
        else {
          eVar6 = ptVar1->value_type;
        }
      }
      else {
        ply->wlength = 0;
      }
      iVar7 = (*ply->odriver->ohandler[(int)eVar6])(ply,value);
      if (iVar7 == 0) {
        bVar10 = false;
        ply_ferror(ply,"Failed writing %s of %s %d (%s: %s)",ptVar1,ptVar13,ply->winstance_index,
                   ply->odriver->name,ply_type_list[(int)eVar6]);
      }
      else {
        lVar3 = ply->wvalue_index;
        ply->wvalue_index = lVar3 + 1;
        if (ply->wlength <= lVar3) {
          ply->wvalue_index = 0;
          ply->wproperty = ply->wproperty + 1;
        }
        lVar3 = ply->wproperty;
        lVar4 = ptVar13->nproperties;
        if (lVar4 <= lVar3) {
          ply->wproperty = 0;
          ply->winstance_index = ply->winstance_index + 1;
        }
        if (ptVar13->ninstances <= ply->winstance_index) {
          ply->winstance_index = 0;
          lVar5 = ply->nelements;
          lVar8 = ply->welement;
          lVar11 = lVar8 + 1;
          if (lVar8 + 1 < lVar5) {
            lVar11 = lVar5;
          }
          lVar12 = lVar8 * 0x118 + 0x218;
          do {
            lVar8 = lVar8 + 1;
            lVar9 = lVar11;
            if (lVar5 <= lVar8) break;
            pcVar2 = ply->element->name + lVar12;
            lVar12 = lVar12 + 0x118;
            lVar9 = lVar8;
          } while (*(long *)pcVar2 == 0);
          ply->welement = lVar9;
        }
        bVar10 = true;
        if (ply->storage_mode == PLY_ASCII) {
          if (lVar3 < lVar4) {
            iVar7 = 0x20;
          }
          else {
            iVar7 = 10;
          }
          iVar7 = putc(iVar7,(FILE *)ply->fp);
          bVar10 = 0 < iVar7;
        }
      }
      goto LAB_0031b666;
    }
  }
  bVar10 = false;
LAB_0031b666:
  return (int)bVar10;
}

Assistant:

int ply_write(p_ply ply, double value) {
    p_ply_element element = NULL;
    p_ply_property property = NULL;
    int type = -1;
    int breakafter = 0;
    int spaceafter = 1;
    if (ply->welement > ply->nelements) return 0;
    element = &ply->element[ply->welement];
    if (ply->wproperty > element->nproperties) return 0;
    property = &element->property[ply->wproperty];
    if (property->type == PLY_LIST) {
        if (ply->wvalue_index == 0) {
            type = property->length_type;
            ply->wlength = (long)value;
        } else
            type = property->value_type;
    } else {
        type = property->type;
        ply->wlength = 0;
    }
    if (!ply->odriver->ohandler[type](ply, value)) {
        ply_ferror(ply, "Failed writing %s of %s %d (%s: %s)", property->name,
                   element->name, ply->winstance_index, ply->odriver->name,
                   ply_type_list[type]);
        return 0;
    }
    ply->wvalue_index++;
    if (ply->wvalue_index > ply->wlength) {
        ply->wvalue_index = 0;
        ply->wproperty++;
    }
    if (ply->wproperty >= element->nproperties) {
        ply->wproperty = 0;
        ply->winstance_index++;
        breakafter = 1;
        spaceafter = 0;
    }
    if (ply->winstance_index >= element->ninstances) {
        ply->winstance_index = 0;
        do {
            ply->welement++;
            element = &ply->element[ply->welement];
        } while (ply->welement < ply->nelements && !element->ninstances);
    }
    if (ply->storage_mode == PLY_ASCII) {
        return (!spaceafter || putc(' ', ply->fp) > 0) &&
               (!breakafter || putc('\n', ply->fp) > 0);
    } else {
        return 1;
    }
}